

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

bool __thiscall AddrManImpl::Good(AddrManImpl *this,CService *addr,NodeSeconds time)

{
  long lVar1;
  byte bVar2;
  char *in_RSI;
  AnnotatedMixin<std::mutex> *in_RDI;
  long in_FS_OFFSET;
  bool ret;
  undefined1 in_stack_0000002f;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock5;
  NodeSeconds in_stack_000000c8;
  Mutex *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffbb;
  int in_stack_ffffffffffffffbc;
  AddrManImpl *in_stack_ffffffffffffffc0;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld(in_stack_ffffffffffffff98);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffffd8,in_RDI,in_RSI,(char *)in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffbc,(bool)in_stack_ffffffffffffffbb);
  Check(in_stack_ffffffffffffffc0);
  bVar2 = Good_(this,addr,(bool)in_stack_0000002f,in_stack_000000c8);
  Check(in_stack_ffffffffffffffc0);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool AddrManImpl::Good(const CService& addr, NodeSeconds time)
{
    LOCK(cs);
    Check();
    auto ret = Good_(addr, /*test_before_evict=*/true, time);
    Check();
    return ret;
}